

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec,Vec_Ptr_t *candVec)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vNewIntVec;
  Vec_Int_t *vCand;
  int i;
  Vec_Ptr_t *candVec_local;
  Vec_Ptr_t *masterVec_local;
  
  if (masterVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("masterVec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/disjunctiveMonotone.c"
                  ,0x23c,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (candVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("candVec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/disjunctiveMonotone.c"
                  ,0x23d,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (vCand._4_4_ = 0; iVar1 = Vec_PtrSize(candVec), vCand._4_4_ < iVar1;
      vCand._4_4_ = vCand._4_4_ + 1) {
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(candVec,vCand._4_4_);
    pVVar2 = Vec_IntDup(pVVar2);
    Vec_PtrPush(masterVec,pVVar2);
  }
  return;
}

Assistant:

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec, Vec_Ptr_t *candVec )
{
    int i;
    Vec_Int_t *vCand;
    Vec_Int_t *vNewIntVec;

    assert(masterVec != NULL);
    assert(candVec != NULL);
    Vec_PtrForEachEntry( Vec_Int_t *, candVec, vCand, i )
    {
        vNewIntVec = Vec_IntDup(vCand);    
        Vec_PtrPush(masterVec, vNewIntVec);
    }
}